

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O3

int Abc_NtkDontCareCompute(Odc_Man_t *p,Abc_Obj_t *pNode,Vec_Ptr_t *vLeaves,uint *puTruth)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  timespec ts;
  timespec local_40;
  
  iVar3 = clock_gettime(3,&local_40);
  if (iVar3 < 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  p->nWins = p->nWins + 1;
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcOdc.c"
                  ,0x411,
                  "int Abc_NtkDontCareCompute(Odc_Man_t *, Abc_Obj_t *, Vec_Ptr_t *, unsigned int *)"
                 );
  }
  if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcOdc.c"
                  ,0x412,
                  "int Abc_NtkDontCareCompute(Odc_Man_t *, Abc_Obj_t *, Vec_Ptr_t *, unsigned int *)"
                 );
  }
  if (vLeaves->nSize <= p->nVarsMax) {
    p->vLeaves = vLeaves;
    p->pNode = pNode;
    iVar3 = clock_gettime(3,&local_40);
    if (iVar3 < 0) {
      lVar6 = 1;
    }
    else {
      lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
      lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_40.tv_sec * -1000000;
    }
    iVar3 = Abc_NtkDontCareWindow(p);
    iVar4 = clock_gettime(3,&local_40);
    if (iVar4 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    p->timeWin = p->timeWin + lVar7 + lVar6;
    if (iVar3 == 0) {
      iVar3 = clock_gettime(3,&local_40);
      if (iVar3 < 0) {
        lVar6 = -1;
      }
      else {
        lVar6 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
      }
      p->timeAbort = p->timeAbort + lVar6 + lVar5;
      memset(puTruth,0xff,(long)p->nWords << 2);
      p->nWinsEmpty = p->nWinsEmpty + 1;
    }
    else {
      if (p->fVeryVerbose != 0) {
        printf(" %5d : ",(ulong)(uint)pNode->Id);
        printf("Leaf = %2d ",(ulong)(uint)p->vLeaves->nSize);
        printf("Root = %2d ",(ulong)(uint)p->vRoots->nSize);
        printf("Bran = %2d ",(ulong)(uint)p->vBranches->nSize);
        printf(" |  ");
      }
      iVar3 = clock_gettime(3,&local_40);
      if (iVar3 < 0) {
        lVar6 = 1;
      }
      else {
        lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
        lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_40.tv_sec * -1000000;
      }
      Abc_NtkDontCareTransfer(p);
      iVar3 = clock_gettime(3,&local_40);
      if (iVar3 < 0) {
        lVar7 = -1;
      }
      else {
        lVar7 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
      }
      p->timeMiter = p->timeMiter + lVar7 + lVar6;
      iVar3 = clock_gettime(3,&local_40);
      if (iVar3 < 0) {
        lVar6 = 1;
      }
      else {
        lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
        lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_40.tv_sec * -1000000;
      }
      iVar3 = Abc_NtkDontCareSimulateBefore(p,puTruth);
      iVar4 = clock_gettime(3,&local_40);
      if (iVar4 < 0) {
        lVar7 = -1;
      }
      else {
        lVar7 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
      }
      p->timeSim = p->timeSim + lVar7 + lVar6;
      if (p->fVeryVerbose != 0) {
        printf("AIG = %5d ",(ulong)(uint)(~p->nPis + p->nObjs));
        printf("%6.2f %%  ",((double)(p->nBits - iVar3) * 100.0) / (double)p->nBits);
      }
      if ((double)p->nPercCutoff <= ((double)(p->nBits - iVar3) * 100.0) / (double)p->nBits) {
        iVar3 = clock_gettime(3,&local_40);
        if (iVar3 < 0) {
          lVar6 = 1;
        }
        else {
          lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
          lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_40.tv_sec * -1000000;
        }
        iVar3 = Abc_NtkDontCareQuantify(p);
        iVar4 = clock_gettime(3,&local_40);
        if (iVar4 < 0) {
          lVar7 = -1;
        }
        else {
          lVar7 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
        }
        p->timeQuant = p->timeQuant + lVar7 + lVar6;
        if (iVar3 != 0) {
          iVar3 = clock_gettime(3,&local_40);
          if (iVar3 < 0) {
            lVar6 = 1;
          }
          else {
            lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
            lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_40.tv_sec * -1000000;
          }
          Abc_NtkDontCareSimulateSetElem(p);
          iVar3 = Abc_NtkDontCareSimulate(p,puTruth);
          iVar4 = clock_gettime(3,&local_40);
          if (iVar4 < 0) {
            lVar7 = -1;
          }
          else {
            lVar7 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
          }
          p->timeTruth = p->timeTruth + lVar7 + lVar6;
          if (p->fVeryVerbose != 0) {
            printf("AIG = %5d ",(ulong)(uint)(~p->nPis + p->nObjs));
            printf("%6.2f %%  ",((double)(p->nBits - iVar3) * 100.0) / (double)p->nBits);
            putchar(10);
          }
          iVar4 = clock_gettime(3,&local_40);
          if (iVar4 < 0) {
            lVar6 = -1;
          }
          else {
            lVar6 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
          }
          p->timeTotal = p->timeTotal + lVar6 + lVar5;
          uVar1 = p->nWinsFinish;
          uVar2 = p->nTotalDcs;
          p->nWinsFinish = uVar1 + 1;
          p->nTotalDcs = (int)(((double)(p->nBits - iVar3) * 100.0) / (double)p->nBits) + uVar2;
          return iVar3;
        }
        iVar3 = clock_gettime(3,&local_40);
        if (iVar3 < 0) {
          lVar6 = -1;
        }
        else {
          lVar6 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
        }
        p->timeAbort = p->timeAbort + lVar6 + lVar5;
        if (p->fVeryVerbose != 0) {
          puts("=== Overflow! ===");
        }
        memset(puTruth,0xff,(long)p->nWords << 2);
        p->nQuantsOver = p->nQuantsOver + 1;
      }
      else {
        iVar3 = clock_gettime(3,&local_40);
        if (iVar3 < 0) {
          lVar6 = -1;
        }
        else {
          lVar6 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
        }
        p->timeAbort = p->timeAbort + lVar6 + lVar5;
        if (p->fVeryVerbose != 0) {
          puts("Simulation cutoff.");
        }
        memset(puTruth,0xff,(long)p->nWords << 2);
        p->nSimsEmpty = p->nSimsEmpty + 1;
      }
    }
    return 0;
  }
  __assert_fail("Vec_PtrSize(vLeaves) <= p->nVarsMax",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcOdc.c"
                ,0x413,
                "int Abc_NtkDontCareCompute(Odc_Man_t *, Abc_Obj_t *, Vec_Ptr_t *, unsigned int *)")
  ;
}

Assistant:

int Abc_NtkDontCareCompute( Odc_Man_t * p, Abc_Obj_t * pNode, Vec_Ptr_t * vLeaves, unsigned * puTruth )
{
    int nMints, RetValue;
    abctime clk, clkTotal = Abc_Clock();

    p->nWins++;
    
    // set the parameters
    assert( !Abc_ObjIsComplement(pNode) );
    assert( Abc_ObjIsNode(pNode) );
    assert( Vec_PtrSize(vLeaves) <= p->nVarsMax );
    p->vLeaves = vLeaves;
    p->pNode = pNode;

    // compute the window
clk = Abc_Clock();
    RetValue = Abc_NtkDontCareWindow( p );
p->timeWin += Abc_Clock() - clk;
    if ( !RetValue )
    {
p->timeAbort += Abc_Clock() - clkTotal;
        Abc_InfoFill( puTruth, p->nWords );
        p->nWinsEmpty++;        
        return 0;
    }

    if ( p->fVeryVerbose )
    {
        printf( " %5d : ", pNode->Id );
        printf( "Leaf = %2d ", Vec_PtrSize(p->vLeaves) );
        printf( "Root = %2d ", Vec_PtrSize(p->vRoots) );
        printf( "Bran = %2d ", Vec_PtrSize(p->vBranches) );
        printf( " |  " );
    }

    // transfer the window into the AIG package
clk = Abc_Clock();
    Abc_NtkDontCareTransfer( p );
p->timeMiter += Abc_Clock() - clk;

    // simulate to estimate the amount of don't-cares
clk = Abc_Clock();
    nMints = Abc_NtkDontCareSimulateBefore( p, puTruth );
p->timeSim += Abc_Clock() - clk;
    if ( p->fVeryVerbose )
    {
        printf( "AIG = %5d ", Odc_NodeNum(p) );
        printf( "%6.2f %%  ", 100.0 * (p->nBits - nMints) / p->nBits );
    }

    // if there is less then the given percentage of don't-cares, skip
    if ( 100.0 * (p->nBits - nMints) / p->nBits < 1.0 * p->nPercCutoff )
    {
p->timeAbort += Abc_Clock() - clkTotal;
        if ( p->fVeryVerbose )
            printf( "Simulation cutoff.\n" );
        Abc_InfoFill( puTruth, p->nWords );
        p->nSimsEmpty++;
        return 0;
    }

    // quantify external variables
clk = Abc_Clock();
    RetValue = Abc_NtkDontCareQuantify( p );
p->timeQuant += Abc_Clock() - clk;
    if ( !RetValue )
    {
p->timeAbort += Abc_Clock() - clkTotal;
        if ( p->fVeryVerbose )
            printf( "=== Overflow! ===\n" );
        Abc_InfoFill( puTruth, p->nWords );
        p->nQuantsOver++;
        return 0;
    }

    // get the truth table
clk = Abc_Clock();
    Abc_NtkDontCareSimulateSetElem( p );
    nMints = Abc_NtkDontCareSimulate( p, puTruth );
p->timeTruth += Abc_Clock() - clk;
    if ( p->fVeryVerbose )
    {
        printf( "AIG = %5d ", Odc_NodeNum(p) );
        printf( "%6.2f %%  ", 100.0 * (p->nBits - nMints) / p->nBits );
        printf( "\n" );
    }
p->timeTotal += Abc_Clock() - clkTotal;
    p->nWinsFinish++;
    p->nTotalDcs += (int)(100.0 * (p->nBits - nMints) / p->nBits);
    return nMints;
}